

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

Status __thiscall
sentencepiece::SentencePieceTrainer::PopulateNormalizerSpec
          (SentencePieceTrainer *this,NormalizerSpec *normalizer_spec,bool is_denormalizer)

{
  ostringstream *poVar1;
  char *pcVar2;
  undefined8 *puVar3;
  string *psVar4;
  void *pvVar5;
  string_view name;
  string_view filename;
  CharsMap chars_map;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  size_t local_178;
  ios_base local_128 [264];
  
  if (normalizer_spec == (NormalizerSpec *)0x0) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::operator<<(poVar1,0xee);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"normalizer_spec",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else {
    puVar3 = (undefined8 *)
             ((ulong)(normalizer_spec->normalization_rule_tsv_).tagged_ptr_.ptr_ &
             0xfffffffffffffffe);
    if (puVar3[1] == 0) {
      if (!is_denormalizer) {
        if (*(long *)(((ulong)(normalizer_spec->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8)
            == 0) {
          *(byte *)(normalizer_spec->_has_bits_).has_bits_ =
               (byte)(normalizer_spec->_has_bits_).has_bits_[0] | 1;
          local_1a0 = (undefined1  [8])(local_1a0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a0,(anonymous_namespace)::kDefaultNormalizerName,0x259a28);
          pvVar5 = (normalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar5 & 1) != 0) {
            pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set(&normalizer_spec->name_,local_1a0,pvVar5);
          if (local_1a0 != (undefined1  [8])(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0,(ulong)((long)&(local_198._M_parent)->_M_color + 1));
          }
        }
        if (*(long *)(((ulong)(normalizer_spec->precompiled_charsmap_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8) == 0) {
          pvVar5 = (normalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)
                   ((ulong)(normalizer_spec->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          psVar4 = (string *)*puVar3;
          pcVar2 = (char *)puVar3[1];
          (normalizer_spec->_has_bits_).has_bits_[0] =
               (normalizer_spec->_has_bits_).has_bits_[0] | 2;
          if (((ulong)pvVar5 & 1) != 0) {
            pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                    (&normalizer_spec->precompiled_charsmap_,pvVar5);
          name._M_str = pcVar2;
          name._M_len = (size_t)this;
          normalizer::Builder::GetPrecompiledCharsMap(name,psVar4);
          if (*(long *)this != 0) {
            return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )this;
          }
          util::Status::~Status((Status *)this);
        }
      }
LAB_0020f76f:
      util::Status::Status((Status *)this);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    if (*(long *)(((ulong)(normalizer_spec->precompiled_charsmap_).tagged_ptr_.ptr_ &
                  0xfffffffffffffffe) + 8) == 0) {
      local_198._M_left = (_Base_ptr)(local_1a0 + 8);
      local_198._M_color = _S_red;
      local_198._M_parent = (_Base_ptr)0x0;
      local_178 = 0;
      filename._M_str = (char *)puVar3[1];
      filename._M_len = (size_t)this;
      local_198._M_right = local_198._M_left;
      normalizer::Builder::LoadCharsMap(filename,(CharsMap *)*puVar3);
      if (*(long *)this == 0) {
        util::Status::~Status((Status *)this);
        *(byte *)(normalizer_spec->_has_bits_).has_bits_ =
             (byte)(normalizer_spec->_has_bits_).has_bits_[0] | 2;
        pvVar5 = (normalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pvVar5 & 1) != 0) {
          pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
        psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                           (&normalizer_spec->precompiled_charsmap_,pvVar5);
        normalizer::Builder::CompileCharsMap((Builder *)this,(CharsMap *)local_1a0,psVar4);
        if (*(long *)this == 0) {
          util::Status::~Status((Status *)this);
          *(byte *)(normalizer_spec->_has_bits_).has_bits_ =
               (byte)(normalizer_spec->_has_bits_).has_bits_[0] | 1;
          local_1c0[0] = local_1b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"user_defined","");
          pvVar5 = (normalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar5 & 1) != 0) {
            pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set(&normalizer_spec->name_,local_1c0,pvVar5);
          if (local_1c0[0] != local_1b0) {
            operator_delete(local_1c0[0],local_1b0[0] + 1);
          }
          std::
          _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       *)local_1a0);
          goto LAB_0020f76f;
        }
      }
      std::
      _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)local_1a0);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::operator<<(poVar1,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"normalizer_spec->precompiled_charsmap().empty()",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"precompiled_charsmap is already defined.",0x28);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  std::ios_base::~ios_base(local_128);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceTrainer::PopulateNormalizerSpec(
    NormalizerSpec *normalizer_spec, bool is_denormalizer) {
  CHECK_OR_RETURN(normalizer_spec);

  if (!normalizer_spec->normalization_rule_tsv().empty()) {
    CHECK_OR_RETURN(normalizer_spec->precompiled_charsmap().empty())
        << "precompiled_charsmap is already defined.";
    normalizer::Builder::CharsMap chars_map;
    RETURN_IF_ERROR(normalizer::Builder::LoadCharsMap(
        normalizer_spec->normalization_rule_tsv(), &chars_map));
    RETURN_IF_ERROR(normalizer::Builder::CompileCharsMap(
        chars_map, normalizer_spec->mutable_precompiled_charsmap()));
    normalizer_spec->set_name("user_defined");
  } else if (!is_denormalizer) {
    if (normalizer_spec->name().empty()) {
      normalizer_spec->set_name(kDefaultNormalizerName);
    }
    if (normalizer_spec->precompiled_charsmap().empty()) {
      RETURN_IF_ERROR(normalizer::Builder::GetPrecompiledCharsMap(
          normalizer_spec->name(),
          normalizer_spec->mutable_precompiled_charsmap()));
    }
  }

  return util::OkStatus();
}